

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateMessageFile
               (FileDescriptor *file,Descriptor *message,bool is_descriptor,
               GeneratorContext *generator_context)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  MessageOptions *this;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output_00;
  ulong uVar4;
  FieldDescriptor *field_00;
  OneofDescriptor *oneof_00;
  string *psVar5;
  Descriptor *message_00;
  EnumDescriptor *en;
  undefined1 is_descriptor_00;
  int local_1f8;
  int local_1f4;
  int i_5;
  int i_4;
  OneofDescriptor *local_1d0;
  OneofDescriptor *oneof_1;
  FieldDescriptor *pFStack_1c0;
  int i_3;
  FieldDescriptor *field_1;
  undefined1 local_1b0 [4];
  int i_2;
  string metadata_fullname;
  string metadata_filename;
  OneofDescriptor *oneof;
  int i_1;
  FieldDescriptor *field;
  undefined1 local_150 [4];
  int i;
  string local_130;
  int local_10c;
  undefined1 local_108 [4];
  int lastindex;
  string fullname;
  Printer printer;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_50;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  string filename;
  GeneratorContext *generator_context_local;
  bool is_descriptor_local;
  Descriptor *message_local;
  FileDescriptor *file_local;
  GeneratorContext *pGVar6;
  
  pGVar6 = generator_context;
  this = Descriptor::options(message);
  is_descriptor_00 = SUB81(pGVar6,0);
  bVar1 = MessageOptions::map_entry(this);
  if (!bVar1) {
    GeneratedMessageFileName_abi_cxx11_
              ((string *)&output,(php *)message,(Descriptor *)(ulong)(is_descriptor & 1),
               (bool)is_descriptor_00);
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,(string *)&output);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
              (&local_50,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2));
    output_00 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_50);
    io::Printer::Printer((Printer *)((long)&fullname.field_2 + 8),output_00,'^');
    GenerateHead(file,(Printer *)((long)&fullname.field_2 + 8));
    FilenameToClassname((string *)local_108,(string *)&output);
    local_10c = std::__cxx11::string::find_last_of(local_108,0x5d00ab);
    FileDescriptor::package_abi_cxx11_(file);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::substr((ulong)&local_130,(ulong)local_108);
      io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"namespace ^name^;\n\n","name",
                         &local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
    GenerateUseDeclaration(is_descriptor,(Printer *)((long)&fullname.field_2 + 8));
    GenerateMessageDocComment((Printer *)((long)&fullname.field_2 + 8),message);
    if (local_10c == -1) {
      io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),
                         "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n{\n","name",
                         (string *)local_108);
    }
    else {
      std::__cxx11::string::substr((ulong)local_150,(ulong)local_108);
      io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),
                         "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n{\n","name",
                         (string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
    }
    Indent((Printer *)((long)&fullname.field_2 + 8));
    for (field._4_4_ = 0; iVar2 = Descriptor::field_count(message), field._4_4_ < iVar2;
        field._4_4_ = field._4_4_ + 1) {
      field_00 = Descriptor::field(message,field._4_4_);
      GenerateField(field_00,(Printer *)((long)&fullname.field_2 + 8),is_descriptor);
    }
    for (oneof._4_4_ = 0; iVar2 = Descriptor::oneof_decl_count(message), oneof._4_4_ < iVar2;
        oneof._4_4_ = oneof._4_4_ + 1) {
      oneof_00 = Descriptor::oneof_decl(message,oneof._4_4_);
      GenerateOneofField(oneof_00,(Printer *)((long)&fullname.field_2 + 8));
    }
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"\n");
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"public function __construct() {\n")
    ;
    Indent((Printer *)((long)&fullname.field_2 + 8));
    psVar5 = FileDescriptor::name_abi_cxx11_(file);
    GeneratedMetadataFileName((string *)((long)&metadata_fullname.field_2 + 8),psVar5,is_descriptor)
    ;
    FilenameToClassname((string *)local_1b0,(string *)((long)&metadata_fullname.field_2 + 8));
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),
                       "\\^fullname^::initOnce();\nparent::__construct();\n","fullname",
                       (string *)local_1b0);
    Outdent((Printer *)((long)&fullname.field_2 + 8));
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"}\n\n");
    for (field_1._4_4_ = 0; iVar2 = field_1._4_4_, iVar3 = Descriptor::field_count(message),
        iVar2 < iVar3; field_1._4_4_ = field_1._4_4_ + 1) {
      pFStack_1c0 = Descriptor::field(message,field_1._4_4_);
      GenerateFieldAccessor(pFStack_1c0,is_descriptor,(Printer *)((long)&fullname.field_2 + 8));
    }
    for (oneof_1._4_4_ = 0; iVar2 = oneof_1._4_4_, iVar3 = Descriptor::oneof_decl_count(message),
        iVar2 < iVar3; oneof_1._4_4_ = oneof_1._4_4_ + 1) {
      local_1d0 = Descriptor::oneof_decl(message,oneof_1._4_4_);
      psVar5 = OneofDescriptor::name_abi_cxx11_(local_1d0);
      UnderscoresToCamelCase((string *)&i_5,psVar5,true);
      psVar5 = OneofDescriptor::name_abi_cxx11_(local_1d0);
      io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),
                         "public function get^camel_name^()\n{\n    return $this->whichOneof(\"^name^\");\n}\n\n"
                         ,"camel_name",(string *)&i_5,"name",psVar5);
      std::__cxx11::string::~string((string *)&i_5);
    }
    Outdent((Printer *)((long)&fullname.field_2 + 8));
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"}\n\n");
    for (local_1f4 = 0; iVar2 = Descriptor::nested_type_count(message), local_1f4 < iVar2;
        local_1f4 = local_1f4 + 1) {
      message_00 = Descriptor::nested_type(message,local_1f4);
      GenerateMessageFile(file,message_00,is_descriptor,generator_context);
    }
    for (local_1f8 = 0; iVar2 = Descriptor::enum_type_count(message), local_1f8 < iVar2;
        local_1f8 = local_1f8 + 1) {
      en = Descriptor::enum_type(message,local_1f8);
      GenerateEnumFile(file,en,is_descriptor,generator_context);
    }
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)(metadata_fullname.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_108);
    io::Printer::~Printer((Printer *)((long)&fullname.field_2 + 8));
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_50);
    std::__cxx11::string::~string((string *)&output);
  }
  return;
}

Assistant:

void GenerateMessageFile(const FileDescriptor* file, const Descriptor* message,
                         bool is_descriptor,
                         GeneratorContext* generator_context) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  std::string filename = GeneratedMessageFileName(message, is_descriptor);
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (!file->package().empty()) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateUseDeclaration(is_descriptor, &printer);

  GenerateMessageDocComment(&printer, message);
  if (lastindex != string::npos) {
    printer.Print(
        "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  // Field and oneof definitions.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateField(field, &printer, is_descriptor);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneofField(oneof, &printer);
  }
  printer.Print("\n");

  printer.Print(
      "public function __construct() {\n");
  Indent(&printer);

  std::string metadata_filename =
      GeneratedMetadataFileName(file->name(), is_descriptor);
  std::string metadata_fullname = FilenameToClassname(metadata_filename);
  printer.Print(
      "\\^fullname^::initOnce();\n"
      "parent::__construct();\n",
      "fullname", metadata_fullname);

  Outdent(&printer);
  printer.Print("}\n\n");

  // Field and oneof accessors.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateFieldAccessor(field, is_descriptor, &printer);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer.Print(
      "public function get^camel_name^()\n"
      "{\n"
      "    return $this->whichOneof(\"^name^\");\n"
      "}\n\n",
      "camel_name", UnderscoresToCamelCase(oneof->name(), true), "name",
      oneof->name());
  }

  Outdent(&printer);
  printer.Print("}\n\n");

  // Nested messages and enums.
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageFile(file, message->nested_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumFile(file, message->enum_type(i), is_descriptor,
                     generator_context);
  }
}